

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.cpp
# Opt level: O0

int sign(EVP_PKEY_CTX *ctx,uchar *sig,size_t *siglen,uchar *tbs,size_t tbslen)

{
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  initializer_list<unsigned_char> __l_02;
  initializer_list<unsigned_char> __l_03;
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  void *pvVar4;
  size_t sVar5;
  size_t sVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  long lVar9;
  reference pvVar10;
  char *__src;
  undefined8 *puVar11;
  BIO *bp;
  RSA *rsa_00;
  sign_exception *psVar12;
  DER *pDVar13;
  reference this;
  size_type sVar14;
  reference pvVar15;
  size_type uncompSize;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar16;
  allocator<unsigned_char> *paVar17;
  pointer *v_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *v_1_00;
  undefined2 uVar18;
  undefined2 uVar19;
  undefined4 in_stack_fffffffffffff6a4;
  allocator<char> local_781;
  string local_780;
  vec8 local_760;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_748;
  allocator<unsigned_char> local_72a;
  uchar local_729 [9];
  iterator local_720;
  size_type local_718;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_710;
  vec8 local_6f8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_6e0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_6c8;
  allocator<unsigned_char> local_6ae;
  uchar local_6ad [5];
  iterator local_6a8;
  size_type local_6a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_698;
  vec8 local_680;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_668;
  vec8 local_650;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_638;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_620;
  vec8 local_608;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_5f0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_5d8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_5c0;
  allocator<unsigned_char> local_5a2;
  uchar local_5a1 [9];
  iterator local_598;
  size_type local_590;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_588;
  vec8 local_570;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_558;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_540;
  allocator<unsigned_char> local_526;
  uchar local_525 [5];
  iterator local_520;
  size_type local_518;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_510;
  vec8 local_4f8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_4e0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_4c8;
  vec8 local_4b0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_498;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_480;
  allocator<unsigned_char> local_462;
  uchar local_461 [9];
  iterator local_458;
  size_type local_450;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_448;
  vec8 local_430;
  undefined1 local_418 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  uint signLen;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sign;
  DER *cd;
  iterator __end1;
  iterator __begin1;
  DER *__range1;
  undefined1 local_3a8 [4];
  uint32_t timeStamp;
  vector<unsigned_char,_std::allocator<unsigned_char>_> certMetaData;
  DER certData;
  vector<unsigned_char,_std::allocator<unsigned_char>_> certificate;
  RSA *rsa;
  BIO *bio;
  undefined1 local_2f0 [8];
  string pemKey;
  key_exception *ke;
  undefined1 local_2b0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> key;
  uchar digest [20];
  allocator<char> local_279;
  string local_278;
  allocator<char> local_251;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  string local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  undefined1 local_1d0 [8];
  string certSF;
  undefined1 local_1a8 [8];
  string sigHead;
  char *local_168;
  char *ptr;
  char *digestPtr;
  undefined1 local_150 [8];
  vector<char,_std::allocator<char>_> digestCopy;
  uchar sha [20];
  uchar local_f8 [4];
  uint32_t checksum;
  uint8_t manifestSha [20];
  undefined1 local_d8 [8];
  string manifestMF;
  allocator<char> local_a1;
  undefined1 local_a0 [8];
  string head;
  SHA_CTX context;
  string *digestFile_local;
  KeyStore *keyStore_local;
  ZipArchive *zipArchive_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a0,"Manifest-Version: 1.0\r\nCreated-By: 1.0 (Fastzip)\r\n\r\n",
             &local_a1);
  std::allocator<char>::~allocator(&local_a1);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)siglen);
  SHA1_Init((SHA_CTX *)((long)&head.field_2 + 8));
  pvVar4 = (void *)std::__cxx11::string::c_str();
  sVar5 = std::__cxx11::string::length();
  SHA1_Update((SHA_CTX *)((long)&head.field_2 + 8),pvVar4,sVar5);
  SHA1_Final(local_f8,(SHA_CTX *)((long)&head.field_2 + 8));
  pvVar4 = (void *)std::__cxx11::string::c_str();
  sVar6 = std::__cxx11::string::length();
  uVar2 = crc32_fast(pvVar4,sVar6,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(sha + 0x10),"META-INF/MANIFEST.MF",(allocator<char> *)(sha + 0xf));
  uVar7 = std::__cxx11::string::length();
  uVar8 = std::__cxx11::string::length();
  ZipArchive::addFile((ZipArchive *)ctx,(string *)(sha + 0x10),true,uVar7,uVar8,0,uVar2,0);
  std::__cxx11::string::~string((string *)(sha + 0x10));
  std::allocator<char>::~allocator((allocator<char> *)(sha + 0xf));
  iVar3 = std::__cxx11::string::c_str();
  pvVar4 = (void *)std::__cxx11::string::length();
  ZipArchive::write((ZipArchive *)ctx,iVar3,pvVar4,uVar7);
  lVar9 = std::__cxx11::string::length();
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_150,lVar9 + 1,
             (allocator_type *)((long)&digestPtr + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&digestPtr + 7));
  pvVar10 = std::vector<char,_std::allocator<char>_>::operator[]
                      ((vector<char,_std::allocator<char>_> *)local_150,0);
  __src = (char *)std::__cxx11::string::c_str();
  strcpy(pvVar10,__src);
  ptr = std::vector<char,_std::allocator<char>_>::operator[]
                  ((vector<char,_std::allocator<char>_> *)local_150,0);
  while( true ) {
    for (local_168 = ptr;
        (*local_168 != '\0' &&
        ((((*local_168 != '\r' || (local_168[1] != '\n')) || (local_168[2] != '\r')) ||
         (local_168[3] != '\n')))); local_168 = local_168 + 1) {
    }
    if (*local_168 == '\0') break;
    SHA1_Init((SHA_CTX *)((long)&head.field_2 + 8));
    SHA1_Update((SHA_CTX *)((long)&head.field_2 + 8),ptr,(long)(local_168 + 4) - (long)ptr);
    SHA1_Final(&digestCopy.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
               (SHA_CTX *)((long)&head.field_2 + 8));
    base64_encode_abi_cxx11_
              ((string *)((long)&sigHead.field_2 + 8),
               &digestCopy.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,0x14);
    puVar11 = (undefined8 *)std::__cxx11::string::c_str();
    *(undefined8 *)(local_168 + -0x1c) = *puVar11;
    *(undefined8 *)(local_168 + -0x14) = puVar11[1];
    *(undefined8 *)(local_168 + -0xc) = puVar11[2];
    *(undefined4 *)(local_168 + -4) = *(undefined4 *)(puVar11 + 3);
    std::__cxx11::string::~string((string *)(sigHead.field_2._M_local_buf + 8));
    ptr = local_168 + 4;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1a8,
             "Signature-Version: 1.0\r\nCreated-By: 1.0 (Fastzip)\r\nSHA1-Digest-Manifest: ",
             (allocator<char> *)(certSF.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(certSF.field_2._M_local_buf + 0xf));
  base64_encode_abi_cxx11_(&local_230,local_f8,0x14);
  std::operator+(&local_210,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                 &local_230);
  std::operator+(&local_1f0,&local_210,"\r\n\r\n");
  pvVar10 = std::vector<char,_std::allocator<char>_>::operator[]
                      ((vector<char,_std::allocator<char>_> *)local_150,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,pvVar10,&local_251);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0,
                 &local_1f0,&local_250);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator(&local_251);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  pvVar4 = (void *)std::__cxx11::string::c_str();
  sVar6 = std::__cxx11::string::length();
  uVar2 = crc32_fast(pvVar4,sVar6,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_278,"META-INF/CERT.SF",&local_279);
  uVar7 = std::__cxx11::string::length();
  uVar8 = std::__cxx11::string::length();
  uVar18 = 0;
  uVar19 = 0;
  ZipArchive::addFile((ZipArchive *)ctx,&local_278,true,uVar7,uVar8,0,uVar2,0);
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator(&local_279);
  iVar3 = std::__cxx11::string::c_str();
  pvVar4 = (void *)std::__cxx11::string::length();
  ZipArchive::write((ZipArchive *)ctx,iVar3,pvVar4,uVar7);
  key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SHA1_Init((SHA_CTX *)((long)&head.field_2 + 8));
  pvVar4 = (void *)std::__cxx11::string::c_str();
  sVar5 = std::__cxx11::string::size();
  SHA1_Update((SHA_CTX *)((long)&head.field_2 + 8),pvVar4,sVar5);
  SHA1_Final((uchar *)&key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage,
             (SHA_CTX *)((long)&head.field_2 + 8));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2b0);
  KeyStore::getKey((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ke,(KeyStore *)sig);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2b0,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ke);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ke);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&bio,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2b0);
  toPem_abi_cxx11_((string *)local_2f0,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&bio
                  );
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&bio);
  pvVar4 = (void *)std::__cxx11::string::c_str();
  bp = BIO_new_mem_buf(pvVar4,-1);
  rsa_00 = PEM_read_bio_RSAPrivateKey(bp,(RSA **)0x0,(undefined1 *)0x0,(void *)0x0);
  if (rsa_00 == (RSA *)0x0) {
    psVar12 = (sign_exception *)__cxa_allocate_exception(0x10);
    sign_exception::sign_exception(psVar12,"Could not read valid RSA key");
    __cxa_throw(psVar12,&sign_exception::typeinfo,sign_exception::~sign_exception);
  }
  KeyStore::getCert((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&certData.value,
                    (KeyStore *)sig);
  asn1::readDER((DER *)&certMetaData.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,
                (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&certData.value);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_3a8);
  __range1._4_4_ = 0;
  __begin1._M_current._4_4_ = 0;
  pDVar13 = asn1::DER::operator[]
                      ((DER *)&certMetaData.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,
                       (int *)((long)&__begin1._M_current + 4));
  __end1 = asn1::DER::begin(pDVar13);
  cd = (DER *)asn1::DER::end(pDVar13);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<asn1::DER_*,_std::vector<asn1::DER,_std::allocator<asn1::DER>_>_>
                                *)&cd);
    if (!bVar1) {
LAB_0015c732:
      sVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_3a8);
      if (sVar14 != 0) {
        paVar17 = (allocator<unsigned_char> *)
                  ((long)&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
        std::allocator<unsigned_char>::allocator(paVar17);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&signLen,0x400,paVar17);
        std::allocator<unsigned_char>::~allocator
                  ((allocator<unsigned_char> *)
                   ((long)&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&signLen,0);
        v_1 = &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
        RSA_sign(0x40,(uchar *)&key.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,0x14,pvVar15,
                 (uint *)v_1,rsa_00);
        RSA_free(rsa_00);
        BIO_free_all(bp);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&signLen,
                   (ulong)(uint)data.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
        local_461[0] = '*';
        local_461[1] = 0x86;
        local_461[2] = 0x48;
        local_461[3] = 0x86;
        local_461[4] = 0xf7;
        local_461[5] = 0xd;
        local_461[6] = 1;
        local_461[7] = 7;
        local_461[8] = 2;
        local_458 = local_461;
        local_450 = 9;
        std::allocator<unsigned_char>::allocator(&local_462);
        __l_03._M_len = local_450;
        __l_03._M_array = local_458;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&local_448,__l_03,&local_462);
        asn1::mkBIN(&local_430,'\x06',&local_448);
        asn1::mkINT(&local_4b0,1);
        builtin_memcpy(local_525,"+\x0e\x03\x02\x1a",5);
        local_520 = local_525;
        local_518 = 5;
        std::allocator<unsigned_char>::allocator(&local_526);
        __l_02._M_len = local_518;
        __l_02._M_array = local_520;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&local_510,__l_02,&local_526);
        asn1::mkBIN(&local_4f8,'\x06',&local_510);
        asn1::mkNIL();
        pvVar16 = &local_540;
        asn1::
        mkSEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  (&local_4e0,(asn1 *)0x30,(uint8_t)&local_4f8,pvVar16,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)v_1);
        asn1::mkSEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  (&local_4c8,(asn1 *)0x31,(uint8_t)&local_4e0,pvVar16);
        local_5a1[0] = '*';
        local_5a1[1] = 0x86;
        local_5a1[2] = 0x48;
        local_5a1[3] = 0x86;
        local_5a1[4] = 0xf7;
        local_5a1[5] = 0xd;
        local_5a1[6] = 1;
        local_5a1[7] = 7;
        local_5a1[8] = 1;
        local_598 = local_5a1;
        local_590 = 9;
        paVar17 = &local_5a2;
        std::allocator<unsigned_char>::allocator(paVar17);
        __l_01._M_len = local_590;
        __l_01._M_array = local_598;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&local_588,__l_01,paVar17);
        asn1::mkBIN(&local_570,'\x06',&local_588);
        asn1::mkSEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  (&local_558,(asn1 *)0x30,(uint8_t)&local_570,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)paVar17);
        asn1::mkSEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  (&local_5c0,(asn1 *)0xa0,(char)&certData + 'X',
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)paVar17);
        asn1::mkINT(&local_608,1);
        asn1::mkSEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  (&local_638,(asn1 *)0x30,(uint8_t)local_3a8,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)paVar17);
        asn1::mkINT(&local_650,(ulong)__range1._4_4_);
        asn1::
        mkSEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  (&local_620,(asn1 *)0x30,(uint8_t)&local_638,&local_650,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)v_1);
        builtin_memcpy(local_6ad,"+\x0e\x03\x02\x1a",5);
        local_6a8 = local_6ad;
        local_6a0 = 5;
        std::allocator<unsigned_char>::allocator(&local_6ae);
        __l_00._M_len = local_6a0;
        __l_00._M_array = local_6a8;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&local_698,__l_00,&local_6ae);
        asn1::mkBIN(&local_680,'\x06',&local_698);
        asn1::mkNIL();
        asn1::
        mkSEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  (&local_668,(asn1 *)0x30,(uint8_t)&local_680,&local_6c8,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)v_1);
        local_729[0] = '*';
        local_729[1] = 0x86;
        local_729[2] = 0x48;
        local_729[3] = 0x86;
        local_729[4] = 0xf7;
        local_729[5] = 0xd;
        local_729[6] = 1;
        local_729[7] = 1;
        local_729[8] = 1;
        local_720 = local_729;
        local_718 = 9;
        std::allocator<unsigned_char>::allocator(&local_72a);
        __l._M_len = local_718;
        __l._M_array = local_720;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&local_710,__l,&local_72a);
        asn1::mkBIN(&local_6f8,'\x06',&local_710);
        asn1::mkNIL();
        asn1::
        mkSEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  (&local_6e0,(asn1 *)0x30,(uint8_t)&local_6f8,&local_748,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)v_1);
        asn1::mkBIN(&local_760,'\x04',(vec8 *)&signLen);
        pvVar16 = &local_620;
        asn1::
        mkSEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  (&local_5f0,(asn1 *)0x30,(uint8_t)&local_608,pvVar16,&local_668,&local_6e0,
                   &local_760,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT44(in_stack_fffffffffffff6a4,CONCAT22(uVar19,uVar18)));
        asn1::mkSEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  (&local_5d8,(asn1 *)0x31,(uint8_t)&local_5f0,pvVar16);
        pvVar16 = &local_4c8;
        v_1_00 = &local_558;
        asn1::
        mkSEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  (&local_498,(asn1 *)0x30,(uint8_t)&local_4b0,pvVar16,v_1_00,&local_5c0,&local_5d8,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT44(in_stack_fffffffffffff6a4,CONCAT22(uVar19,uVar18)));
        asn1::mkSEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  (&local_480,(asn1 *)0xa0,(uint8_t)&local_498,pvVar16);
        asn1::
        mkSEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_418,(asn1 *)0x30,
                   (uint8_t)&local_430,&local_480,v_1_00);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_480);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_498);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_5d8);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_5f0);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_760);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_6e0);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_748);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_6f8);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_710);
        std::allocator<unsigned_char>::~allocator(&local_72a);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_668);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_6c8);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_680);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_698);
        std::allocator<unsigned_char>::~allocator(&local_6ae);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_620);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_650);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_638);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_608);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_5c0);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_558);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_570);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_588);
        std::allocator<unsigned_char>::~allocator(&local_5a2);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_4c8);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_4e0);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_540);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_4f8);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_510);
        std::allocator<unsigned_char>::~allocator(&local_526);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_4b0);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_430);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_448);
        std::allocator<unsigned_char>::~allocator(&local_462);
        pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_418,0);
        sVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_418);
        uVar2 = crc32_fast(pvVar15,sVar14,0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_780,"META-INF/CERT.RSA",&local_781);
        sVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_418);
        uncompSize = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_418);
        ZipArchive::addFile((ZipArchive *)ctx,&local_780,true,sVar14,uncompSize,0,uVar2,0);
        std::__cxx11::string::~string((string *)&local_780);
        std::allocator<char>::~allocator(&local_781);
        pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_418,0);
        pvVar4 = (void *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    local_418);
        ZipArchive::write((ZipArchive *)ctx,(int)pvVar15,pvVar4,sVar14);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_418);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&signLen);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_3a8);
        asn1::DER::~DER((DER *)&certMetaData.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&certData.value);
        std::__cxx11::string::~string((string *)local_2f0);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2b0);
        std::__cxx11::string::~string((string *)local_1d0);
        std::__cxx11::string::~string((string *)local_1a8);
        std::vector<char,_std::allocator<char>_>::~vector
                  ((vector<char,_std::allocator<char>_> *)local_150);
        std::__cxx11::string::~string((string *)local_d8);
        iVar3 = std::__cxx11::string::~string((string *)local_a0);
        return iVar3;
      }
      psVar12 = (sign_exception *)__cxa_allocate_exception(0x10);
      sign_exception::sign_exception(psVar12,"Could not extract certificate from keystore");
      __cxa_throw(psVar12,&sign_exception::typeinfo,sign_exception::~sign_exception);
    }
    this = __gnu_cxx::
           __normal_iterator<asn1::DER_*,_std::vector<asn1::DER,_std::allocator<asn1::DER>_>_>::
           operator*(&__end1);
    if ((this->tag == '\x02') && (__range1._4_4_ == 0)) {
      __range1._4_4_ = (uint)this->value;
    }
    bVar1 = false;
    if (this->tag == '0') {
      sign.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      pDVar13 = asn1::DER::operator[]
                          (this,(int *)((long)&sign.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                       4));
      bVar1 = pDVar13->tag == '1';
    }
    if (bVar1) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_3a8,&this->data);
      goto LAB_0015c732;
    }
    __gnu_cxx::__normal_iterator<asn1::DER_*,_std::vector<asn1::DER,_std::allocator<asn1::DER>_>_>::
    operator++(&__end1);
  } while( true );
}

Assistant:

void sign(ZipArchive& zipArchive, KeyStore& keyStore, const string& digestFile)
{
    SHA_CTX context;
    string head = "Manifest-Version: 1.0\015\012Created-By: 1.0 "
                  "(Fastzip)\015\012\015\012";

    string manifestMF = head + digestFile;
    uint8_t manifestSha[SHA_LEN];
    SHA1_Init(&context);
    SHA1_Update(&context, manifestMF.c_str(), manifestMF.length());
    SHA1_Final(manifestSha, &context);

    uint32_t checksum = crc32_fast(manifestMF.c_str(), manifestMF.length());
    zipArchive.addFile("META-INF/MANIFEST.MF", true, manifestMF.length(),
                       manifestMF.length(), 0, checksum);
    zipArchive.write((uint8_t*)manifestMF.c_str(), manifestMF.length());

    unsigned char sha[SHA_LEN];

    vector<char> digestCopy(digestFile.length() + 1);
    strcpy(&digestCopy[0], digestFile.c_str());

    char* digestPtr = &digestCopy[0];
    while (true) {
        char* ptr = digestPtr;

        while (*ptr) {
            if (ptr[0] == 0x0d && ptr[1] == 0xa && ptr[2] == 0x0d &&
                ptr[3] == 0x0a)
                break;
            ptr++;
        }

        if (!*ptr)
            break;

        ptr += 4;

        SHA1_Init(&context);
        SHA1_Update(&context, digestPtr, ptr - digestPtr);
        SHA1_Final(sha, &context);
        memcpy(ptr - 32, base64_encode(sha, SHA_LEN).c_str(), 28);

        digestPtr = ptr;
    }
    const string sigHead = "Signature-Version: 1.0\015\012Created-By: 1.0 "
                           "(Fastzip)\015\012SHA1-Digest-Manifest: ";

    string certSF = sigHead + base64_encode(manifestSha, SHA_LEN) +
                    "\015\012\015\012" + string(&digestCopy[0]);

    checksum = crc32_fast(certSF.c_str(), certSF.length());
    zipArchive.addFile("META-INF/CERT.SF", true, certSF.length(),
                       certSF.length(), 0, checksum);
    zipArchive.write((uint8_t*)certSF.c_str(), certSF.length());

    unsigned char digest[SHA_LEN];
    memset(digest, 0, SHA_LEN);

    SHA1_Init(&context);
    SHA1_Update(&context, certSF.c_str(), certSF.size());
    SHA1_Final(digest, &context);

    vector<uint8_t> key;
    try {
        key = keyStore.getKey();
    } catch (key_exception& ke) {
        throw sign_exception(ke);
    }

    string pemKey = toPem(key);
    BIO* bio = BIO_new_mem_buf((void*)pemKey.c_str(), -1);
    RSA* rsa = PEM_read_bio_RSAPrivateKey(bio, NULL, NULL, NULL);
    if (rsa == nullptr)
        throw sign_exception("Could not read valid RSA key");

    vector<uint8_t> certificate = keyStore.getCert();

    // Extract the meta data
    DER certData = readDER(certificate);

    vector<uint8_t> certMetaData;
    uint32_t timeStamp = 0;
    for (auto& cd : certData[0]) {
        if (cd.tag == 0x02 && timeStamp == 0) {
            timeStamp = cd.value;
        }
        if (cd.tag == 0x30 && cd[0].tag == 0x31) {
            certMetaData = cd.data;
            break;
        }
    }

    if (certMetaData.size() == 0)
        throw sign_exception("Could not extract certificate from keystore");

    vector<uint8_t> sign(1024);
    unsigned int signLen;

    RSA_sign(NID_sha1, digest, SHA_LEN, &sign[0], &signLen, rsa);

    RSA_free(rsa);

    BIO_free_all(bio);

    sign.resize(signLen);
    // clang-format off
    auto data =
        mkSEQ(0x30,
            // PKCS7 SIGNED
            mkBIN(0x6, { 0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d, 0x01, 0x07, 0x02 }),
            mkSEQ(0xA0,
                mkSEQ(0x30,
                    mkINT(1),
                    mkSEQ(0x31,
                        mkSEQ(0x30,
                            // SHA1
                            mkBIN(0x6, { 0x2b, 0x0e, 0x03, 0x02, 0x1a }),
                            mkNIL()
                            )
                        ),
                    mkSEQ(0x30,
                        // PKC7
                        mkBIN(0x6, { 0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d, 0x01, 0x07, 0x01 })
                        ),
                    mkSEQ(0xA0, certificate),
                    mkSEQ(0x31,
                        mkSEQ(0x30,
                            mkINT(1),
                            mkSEQ(0x30,
                                mkSEQ(0x30, certMetaData),
                                mkINT(timeStamp)
                                ),
                            mkSEQ(0x30,
                                // SHA1
                                mkBIN(0x6, { 0x2b, 0xe, 0x3, 0x2, 0x1a}),
                                mkNIL()
                                ),
                            mkSEQ(0x30,
                                // RSA ENCRYPTION,
                                mkBIN(0x6, {0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d, 0x01, 0x01, 0x01 }),
                                mkNIL()
                                ),
                            mkBIN(0x04, sign)
                            )
                        )
                    )
                )
            );
	// clang-format off
    checksum = crc32_fast(&data[0], data.size());
    zipArchive.addFile("META-INF/CERT.RSA", true, data.size(), data.size(), 0, checksum);
    zipArchive.write(&data[0], data.size());
}